

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::Configurations::setGlobally
          (Configurations *this,ConfigurationType configurationType,string *value,
          bool includeGlobalLevel)

{
  byte in_CL;
  anon_class_32_4_9afad3aa *in_RDI;
  EnumType lIndex;
  _Any_data *fn;
  EnumType *startIndex;
  string *in_stack_ffffffffffffff90;
  ConfigurationType in_stack_ffffffffffffff98;
  Level in_stack_ffffffffffffff9c;
  Configurations *in_stack_ffffffffffffffa0;
  EnumType local_40 [8];
  _Any_data local_20 [2];
  
  local_20[0]._7_1_ = in_CL & 1;
  if (local_20[0]._7_1_ != 0) {
    set(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
        in_stack_ffffffffffffff90);
  }
  local_20[0]._0_4_ = 2;
  fn = local_20;
  startIndex = local_40;
  std::function<bool()>::
  function<el::Configurations::setGlobally(el::ConfigurationType,std::__cxx11::string_const&,bool)::__0,void>
            ((function<bool_()> *)in_stack_ffffffffffffff90,in_RDI);
  LevelHelper::forEachLevel(startIndex,(function<bool_()> *)fn);
  el::base::utils::std::function<bool_()>::~function((function<bool_()> *)0x225dbe);
  return;
}

Assistant:

void Configurations::setGlobally(ConfigurationType configurationType, const std::string& value,
                                 bool includeGlobalLevel) {
  if (includeGlobalLevel) {
    set(Level::Global, configurationType, value);
  }
  base::type::EnumType lIndex = LevelHelper::kMinValid;
  LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
    set(LevelHelper::castFromInt(lIndex), configurationType, value);
    return false;  // Do not break lambda function yet as we need to set all levels regardless
  });
}